

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O2

bool embree::avx::intersect_triangle_triangle
               (Scene *scene0,uint geomID0,uint primID0,Scene *scene1,uint geomID1,uint primID1)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint uVar3;
  Geometry *pGVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  Vec3fa b2;
  Vec3fa b1;
  Vec3fa b0;
  Vec3fa a2;
  Vec3fa a1;
  Vec3fa a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  if ((geomID0 != geomID1 || scene0 != scene1) || primID0 != primID1) {
    pGVar4 = (scene0->geometries).items[geomID0].ptr;
    pGVar5 = (scene1->geometries).items[geomID1].ptr;
    lVar12 = (ulong)primID1 *
             pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar6 = *(long *)&pGVar5->field_0x58;
    lVar11 = (ulong)primID0 *
             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar7 = *(long *)&pGVar4->field_0x58;
    uVar2 = *(ulong *)(lVar7 + lVar11);
    uVar3 = *(uint *)(lVar7 + 8 + lVar11);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar2;
    if (geomID0 != geomID1 || scene0 != scene1) {
      uVar15 = *(uint *)(lVar6 + lVar12);
      uVar13 = *(uint *)(lVar6 + 4 + lVar12);
      uVar14 = *(uint *)(lVar6 + 8 + lVar12);
LAB_00bf64f1:
      lVar6 = *(long *)&pGVar4[1].time_range.upper;
      p_Var8 = pGVar4[1].intersectionFilterN;
      puVar1 = (undefined8 *)
               (lVar6 + CONCAT44((int)((ulong)lVar7 >> 0x20),(int)uVar2) * (long)p_Var8);
      local_18._0_8_ = *puVar1;
      local_18._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (uVar2 >> 0x20) * (long)p_Var8);
      local_28._0_8_ = *puVar1;
      local_28._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar3 * (long)p_Var8);
      local_38._0_8_ = *puVar1;
      local_38._8_8_ = puVar1[1];
      lVar6 = *(long *)&pGVar5[1].time_range.upper;
      p_Var8 = pGVar5[1].intersectionFilterN;
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar15 * (long)p_Var8);
      local_48._0_8_ = *puVar1;
      local_48._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar13 * (long)p_Var8);
      local_58._0_8_ = *puVar1;
      local_58._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar14 * (long)p_Var8);
      local_68._0_8_ = *puVar1;
      local_68._8_8_ = puVar1[1];
      bVar10 = TriangleTriangleIntersector::intersect_triangle_triangle
                         ((Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,
                          (Vec3fa *)&local_38.field_1,(Vec3fa *)&local_48.field_1,
                          (Vec3fa *)&local_58.field_1,(Vec3fa *)&local_68.field_1);
      return bVar10;
    }
    auVar16 = vpinsrd_avx(auVar16,uVar3,2);
    auVar9 = vpinsrd_avx(auVar16,uVar3,3);
    uVar15 = *(uint *)(lVar6 + lVar12);
    auVar16 = vpshufd_avx(ZEXT416(uVar15),0);
    auVar16 = vpcmpeqd_avx(auVar16,auVar9);
    if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf]) {
      uVar13 = *(uint *)(lVar6 + 4 + lVar12);
      auVar16 = vpshufd_avx(ZEXT416(uVar13),0);
      auVar16 = vpcmpeqd_avx(auVar16,auVar9);
      if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf])
      {
        uVar14 = *(uint *)(lVar6 + 8 + lVar12);
        auVar16 = vpshufd_avx(ZEXT416(uVar14),0);
        auVar16 = vpcmpeqd_avx(auVar16,auVar9);
        if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf]
           ) goto LAB_00bf64f1;
      }
    }
  }
  return false;
}

Assistant:

bool intersect_triangle_triangle (Scene* scene0, unsigned geomID0, unsigned primID0, Scene* scene1, unsigned geomID1, unsigned primID1)
    {
      CSTAT(bvh_collide_prim_intersections1++);
      const TriangleMesh* mesh0 = scene0->get<TriangleMesh>(geomID0);
      const TriangleMesh* mesh1 = scene1->get<TriangleMesh>(geomID1);
      const TriangleMesh::Triangle& tri0 = mesh0->triangle(primID0);
      const TriangleMesh::Triangle& tri1 = mesh1->triangle(primID1);
      
      /* special culling for scene intersection with itself */
      if (scene0 == scene1 && geomID0 == geomID1)
      {
        /* ignore self intersections */
        if (primID0 == primID1)
          return false;
      }
      CSTAT(bvh_collide_prim_intersections2++);
      
      if (scene0 == scene1 && geomID0 == geomID1)
      {
        /* ignore intersection with topological neighbors */
        const vint4 t0(tri0.v[0],tri0.v[1],tri0.v[2],tri0.v[2]);
        if (any(vint4(tri1.v[0]) == t0)) return false;
        if (any(vint4(tri1.v[1]) == t0)) return false;
        if (any(vint4(tri1.v[2]) == t0)) return false;
      }
      CSTAT(bvh_collide_prim_intersections3++);
      
      const Vec3fa a0 = mesh0->vertex(tri0.v[0]);
      const Vec3fa a1 = mesh0->vertex(tri0.v[1]);
      const Vec3fa a2 = mesh0->vertex(tri0.v[2]);
      const Vec3fa b0 = mesh1->vertex(tri1.v[0]);
      const Vec3fa b1 = mesh1->vertex(tri1.v[1]);
      const Vec3fa b2 = mesh1->vertex(tri1.v[2]);
      
      return TriangleTriangleIntersector::intersect_triangle_triangle(a0,a1,a2,b0,b1,b2);
    }